

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O2

CURLcode Curl_cf_h1_proxy_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode CVar1;
  Curl_cfilter *in_RAX;
  Curl_cfilter *cf;
  Curl_cfilter *local_18;
  
  local_18 = in_RAX;
  CVar1 = Curl_cf_create(&local_18,&Curl_cft_h1_proxy,(void *)0x0);
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_insert_after(cf_at,local_18);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_h1_proxy_insert_after(struct Curl_cfilter *cf_at,
                                       struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  (void)data;
  result = Curl_cf_create(&cf, &Curl_cft_h1_proxy, NULL);
  if(!result)
    Curl_conn_cf_insert_after(cf_at, cf);
  return result;
}